

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgettextcontrol_p.cpp
# Opt level: O1

void QWidgetTextControl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint uVar1;
  long *plVar2;
  int *piVar3;
  QArrayData *pQVar4;
  void **ppvVar5;
  undefined1 *puVar6;
  undefined1 uVar7;
  int iVar8;
  anon_union_24_3_e3d07ef4_for_data *paVar9;
  anon_union_24_3_e3d07ef4_for_data *paVar10;
  anon_union_24_3_e3d07ef4_for_data *paVar11;
  TextFormat TVar12;
  undefined4 in_register_00000014;
  QString *pQVar13;
  Mode mode;
  undefined4 in_register_00000034;
  QWidgetTextControlPrivate *pQVar14;
  long in_FS_OFFSET;
  void *_a_1 [2];
  void *_a_2 [2];
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined1 *puStack_50;
  void *local_48 [2];
  long local_38;
  
  paVar9 = &local_68;
  paVar10 = &local_68;
  paVar11 = &local_68;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    iVar8 = 0;
    goto LAB_004d2972;
  case 1:
    undoAvailable((QWidgetTextControl *)_o,*_a[1]);
    break;
  case 2:
    redoAvailable((QWidgetTextControl *)_o,*_a[1]);
    break;
  case 3:
    local_68._8_8_ = _a[1];
    local_68.shared = (PrivateShared *)0x0;
    iVar8 = 3;
    goto LAB_004d29f4;
  case 4:
    copyAvailable((QWidgetTextControl *)_o,*_a[1]);
    break;
  case 5:
    iVar8 = 5;
    goto LAB_004d2972;
  case 6:
    iVar8 = 6;
    goto LAB_004d2972;
  case 7:
    paVar9 = (anon_union_24_3_e3d07ef4_for_data *)_a[1];
    goto LAB_004d29d7;
  case 8:
    local_68._16_8_ = (undefined1 *)0x0;
    puStack_50 = (undefined1 *)0x0;
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = (void **)0x0;
    paVar10 = (anon_union_24_3_e3d07ef4_for_data *)local_48;
LAB_004d29d7:
    *(undefined4 *)paVar10 = 0xaaaaaaaa;
    *(undefined4 *)((long)paVar10->data + 4) = 0xaaaaaaaa;
    *(undefined4 *)((long)paVar10->data + 8) = 0xaaaaaaaa;
    *(undefined4 *)((long)paVar10->data + 0xc) = 0xaaaaaaaa;
    paVar10->shared = (PrivateShared *)0x0;
    *(anon_union_24_3_e3d07ef4_for_data **)((long)paVar10->data + 8) = paVar9;
    iVar8 = 7;
    paVar11 = paVar10;
    goto LAB_004d29f4;
  case 9:
    local_68._8_8_ = _a[1];
    local_68.shared = (PrivateShared *)0x0;
    iVar8 = 9;
    paVar11 = &local_68;
    goto LAB_004d29f4;
  case 10:
    local_48[0]._0_4_ = *_a[1];
    local_68._8_8_ = local_48;
    local_68.shared = (PrivateShared *)0x0;
    iVar8 = 10;
    paVar11 = &local_68;
    goto LAB_004d29f4;
  case 0xb:
    local_68._8_8_ = _a[1];
    local_68.shared = (PrivateShared *)0x0;
    iVar8 = 0xb;
    paVar11 = &local_68;
    goto LAB_004d29f4;
  case 0xc:
    iVar8 = 0xc;
LAB_004d2972:
    paVar11 = (anon_union_24_3_e3d07ef4_for_data *)(void **)0x0;
    goto LAB_004d29f4;
  case 0xd:
    local_68._8_8_ = _a[1];
    local_68.shared = (PrivateShared *)0x0;
    iVar8 = 0xd;
    paVar11 = &local_68;
    goto LAB_004d29f4;
  case 0xe:
    local_68._8_8_ = _a[1];
    local_68.shared = (PrivateShared *)0x0;
    iVar8 = 0xe;
    paVar11 = &local_68;
    goto LAB_004d29f4;
  case 0xf:
    local_68._8_8_ = _a[1];
    local_68.shared = (PrivateShared *)0x0;
    iVar8 = 0xf;
    paVar11 = &local_68;
LAB_004d29f4:
    QMetaObject::activate(_o,&staticMetaObject,iVar8,&paVar11->shared);
    break;
  case 0x10:
    modificationChanged((QWidgetTextControl *)_o,*_a[1]);
    break;
  case 0x11:
    pQVar13 = (QString *)_a[1];
    pQVar14 = *(QWidgetTextControlPrivate **)(_o + 8);
    TVar12 = PlainText;
    goto LAB_004d2b24;
  case 0x12:
    pQVar13 = (QString *)_a[1];
    pQVar14 = *(QWidgetTextControlPrivate **)(_o + 8);
    TVar12 = MarkdownText;
    goto LAB_004d2b24;
  case 0x13:
    pQVar13 = (QString *)_a[1];
    pQVar14 = *(QWidgetTextControlPrivate **)(_o + 8);
    TVar12 = RichText;
LAB_004d2b24:
    QWidgetTextControlPrivate::setContent(pQVar14,TVar12,pQVar13,(QTextDocument *)0x0);
    break;
  case 0x14:
    cut((QWidgetTextControl *)_o);
    break;
  case 0x15:
    copy((QWidgetTextControl *)_o,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,_c),
         (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
    break;
  case 0x16:
    mode = *_a[1];
    goto LAB_004d2b35;
  case 0x17:
    mode = Clipboard;
LAB_004d2b35:
    paste((QWidgetTextControl *)_o,mode);
    break;
  case 0x18:
    undo((QWidgetTextControl *)_o);
    break;
  case 0x19:
    redo((QWidgetTextControl *)_o);
    break;
  case 0x1a:
    clear((QWidgetTextControl *)_o);
    break;
  case 0x1b:
    selectAll((QWidgetTextControl *)_o);
    break;
  case 0x1c:
    QTextCursor::insertText((QString *)(*(long *)(_o + 8) + 0x88));
    break;
  case 0x1d:
    QTextCursor::insertHtml((QString *)(*(long *)(_o + 8) + 0x88));
    break;
  case 0x1e:
    pQVar13 = (QString *)_a[1];
    pQVar14 = *(QWidgetTextControlPrivate **)(_o + 8);
    TVar12 = AutoText;
    goto LAB_004d2b02;
  case 0x1f:
    pQVar13 = (QString *)_a[1];
    pQVar14 = *(QWidgetTextControlPrivate **)(_o + 8);
    TVar12 = RichText;
    goto LAB_004d2b02;
  case 0x20:
    pQVar13 = (QString *)_a[1];
    pQVar14 = *(QWidgetTextControlPrivate **)(_o + 8);
    TVar12 = PlainText;
LAB_004d2b02:
    QWidgetTextControlPrivate::append(pQVar14,pQVar13,TVar12);
    break;
  case 0x21:
    QTextDocument::adjustSize();
    break;
  case 0x22:
    QWidgetTextControlPrivate::_q_deleteSelected(*(QWidgetTextControlPrivate **)(_o + 8));
    break;
  case 0x23:
    QWidgetTextControlPrivate::_q_copyLink(*(QWidgetTextControlPrivate **)(_o + 8));
    break;
  case 0x24:
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)_o + 0x68))(&local_68,_o,*_a[1],_a[2]);
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_68);
    }
    ::QVariant::~QVariant((QVariant *)&local_68);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_004d26ba_caseD_3;
      plVar2 = (long *)_a[1];
      if (((code *)*plVar2 == textChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == undoAvailable) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == redoAvailable) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == currentCharFormatChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == copyAvailable) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == selectionChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == cursorPositionChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 6;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == updateRequest) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 7;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == documentSizeChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 9;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == blockCountChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 10;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == visibilityRequest) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0xb;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == microFocusChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0xc;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == linkActivated) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0xd;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == linkHovered) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0xe;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == blockMarkerHovered) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0xf;
        goto switchD_004d26ba_caseD_3;
      }
      if (((code *)*plVar2 == modificationChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0x10;
        goto switchD_004d26ba_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_004d26ba_caseD_3;
        goto switchD_004d26ba_caseD_1;
      }
    }
    goto switchD_004d26ba_caseD_2;
  }
switchD_004d26ba_caseD_1:
  if (6 < (uint)_id) goto LAB_004d2da9;
  piVar3 = (int *)*_a;
  switch(_id) {
  case 0:
    QTextDocument::toHtml();
    pQVar4 = *(QArrayData **)piVar3;
    *(PrivateShared **)piVar3 = local_68.shared;
    ppvVar5 = *(void ***)(piVar3 + 2);
    *(undefined8 *)(piVar3 + 2) = local_68._8_8_;
    puVar6 = *(undefined1 **)(piVar3 + 4);
    *(undefined8 *)(piVar3 + 4) = local_68._16_8_;
    local_68.shared = (PrivateShared *)pQVar4;
    local_68._8_8_ = ppvVar5;
    local_68._16_8_ = puVar6;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    goto LAB_004d2da9;
  case 1:
    uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x110);
    break;
  case 2:
    uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x111);
    break;
  case 3:
    iVar8 = cursorWidth((QWidgetTextControl *)_o);
    goto LAB_004d2d7d;
  case 4:
    iVar8 = *(int *)(*(long *)(_o + 8) + 0xb0);
LAB_004d2d7d:
    *piVar3 = iVar8;
    goto LAB_004d2da9;
  case 5:
    uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x192);
    break;
  case 6:
    uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x191);
  }
  *(undefined1 *)piVar3 = uVar7;
LAB_004d2da9:
  if (_c == WriteProperty) {
switchD_004d26ba_caseD_2:
    if ((uint)_id < 7) {
      pQVar13 = (QString *)*_a;
      switch(_id) {
      case 0:
        QWidgetTextControlPrivate::setContent
                  (*(QWidgetTextControlPrivate **)(_o + 8),RichText,pQVar13,(QTextDocument *)0x0);
        break;
      case 1:
        *(undefined1 *)(*(long *)(_o + 8) + 0x110) = *(undefined1 *)&(pQVar13->d).d;
        break;
      case 2:
        *(undefined1 *)(*(long *)(_o + 8) + 0x111) = *(undefined1 *)&(pQVar13->d).d;
        break;
      case 3:
        setCursorWidth((QWidgetTextControl *)_o,*(int *)&(pQVar13->d).d);
        break;
      case 4:
        uVar1 = *(uint *)&(pQVar13->d).d;
        pQVar14 = *(QWidgetTextControlPrivate **)(_o + 8);
        if (((pQVar14->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i != uVar1) &&
           ((pQVar14->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
            super_QFlagsStorage<Qt::TextInteractionFlag>.i = uVar1, pQVar14->hasFocus == true)) {
          QWidgetTextControlPrivate::setCursorVisible(pQVar14,SUB41((uVar1 & 0x10) >> 4,0));
        }
        break;
      case 5:
        *(undefined1 *)(*(long *)(_o + 8) + 0x192) = *(undefined1 *)&(pQVar13->d).d;
        break;
      case 6:
        *(undefined1 *)(*(long *)(_o + 8) + 0x191) = *(undefined1 *)&(pQVar13->d).d;
      }
    }
  }
switchD_004d26ba_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetTextControl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->updateRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 8: _t->updateRequest(); break;
        case 9: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 10: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->visibilityRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 12: _t->microFocusChanged(); break;
        case 13: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 14: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 15: _t->blockMarkerHovered((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 16: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 17: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste((*reinterpret_cast< std::add_pointer_t<QClipboard::Mode>>(_a[1]))); break;
        case 23: _t->paste(); break;
        case 24: _t->undo(); break;
        case 25: _t->redo(); break;
        case 26: _t->clear(); break;
        case 27: _t->selectAll(); break;
        case 28: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->appendHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 32: _t->appendPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 33: _t->adjustSize(); break;
        case 34: _t->d_func()->_q_deleteSelected(); break;
        case 35: _t->d_func()->_q_copyLink(); break;
        case 36: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextCharFormat & )>(_a, &QWidgetTextControl::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::updateRequest, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QSizeF & )>(_a, &QWidgetTextControl::documentSizeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(int )>(_a, &QWidgetTextControl::blockCountChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::visibilityRequest, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::microFocusChanged, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkActivated, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkHovered, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextBlock & )>(_a, &QWidgetTextControl::blockMarkerHovered, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::modificationChanged, 16))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 4: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->ignoreUnusedNavigationEvents(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 5: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setIgnoreUnusedNavigationEvents(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}